

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_get_buffer_block_decorations
          (spvc_compiler compiler,spvc_variable_id id,SpvDecoration **decorations,
          size_t *num_decorations)

{
  spvc_context psVar1;
  pointer this;
  pointer pTVar2;
  SpvDecoration_ *pSVar3;
  _Hash_node_base *p_Var4;
  exception *e;
  anon_class_8_1_4e5cf973 local_98;
  unique_ptr<TemporaryBuffer<SpvDecoration_>,_std::default_delete<TemporaryBuffer<SpvDecoration_>_>_>
  local_90;
  unique_ptr<TemporaryBuffer<SpvDecoration_>,_std::default_delete<TemporaryBuffer<SpvDecoration_>_>_>
  bitset;
  VariableID local_74;
  undefined1 local_70 [8];
  Bitset flags;
  size_t *num_decorations_local;
  SpvDecoration **decorations_local;
  spvc_variable_id id_local;
  spvc_compiler compiler_local;
  
  flags.higher._M_h._M_single_bucket = (__node_base_ptr)num_decorations;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  spirv_cross::TypedID<(spirv_cross::Types)2>::TypedID(&local_74,id);
  spirv_cross::Compiler::get_buffer_block_flags((Bitset *)local_70,this,local_74);
  spvc_allocate<TemporaryBuffer<SpvDecoration_>>();
  local_98.bitset = &local_90;
  spirv_cross::Bitset::for_each_bit<spvc_compiler_get_buffer_block_decorations::__0>
            ((Bitset *)local_70,&local_98);
  pTVar2 = std::
           unique_ptr<TemporaryBuffer<SpvDecoration_>,_std::default_delete<TemporaryBuffer<SpvDecoration_>_>_>
           ::operator->(&local_90);
  pSVar3 = spirv_cross::VectorView<SpvDecoration_>::data
                     (&(pTVar2->buffer).super_VectorView<SpvDecoration_>);
  *decorations = pSVar3;
  pTVar2 = std::
           unique_ptr<TemporaryBuffer<SpvDecoration_>,_std::default_delete<TemporaryBuffer<SpvDecoration_>_>_>
           ::operator->(&local_90);
  p_Var4 = (_Hash_node_base *)
           spirv_cross::VectorView<SpvDecoration_>::size
                     (&(pTVar2->buffer).super_VectorView<SpvDecoration_>);
  (flags.higher._M_h._M_single_bucket)->_M_nxt = p_Var4;
  psVar1 = compiler->context;
  std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
  unique_ptr<TemporaryBuffer<SpvDecoration_>,std::default_delete<TemporaryBuffer<SpvDecoration_>>,void>
            ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *)&e,
             &local_90);
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&psVar1->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
  ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::
  unique_ptr<TemporaryBuffer<SpvDecoration_>,_std::default_delete<TemporaryBuffer<SpvDecoration_>_>_>
  ::~unique_ptr(&local_90);
  spirv_cross::Bitset::~Bitset((Bitset *)local_70);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_buffer_block_decorations(spvc_compiler compiler, spvc_variable_id id,
                                                       const SpvDecoration **decorations, size_t *num_decorations)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto flags = compiler->compiler->get_buffer_block_flags(id);
		auto bitset = spvc_allocate<TemporaryBuffer<SpvDecoration>>();

		flags.for_each_bit([&](uint32_t bit) { bitset->buffer.push_back(static_cast<SpvDecoration>(bit)); });

		*decorations = bitset->buffer.data();
		*num_decorations = bitset->buffer.size();
		compiler->context->allocations.push_back(std::move(bitset));
	}